

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::AlignmentTests_TrimBack_Test::~AlignmentTests_TrimBack_Test
          (AlignmentTests_TrimBack_Test *this)

{
  AlignmentTests_TrimBack_Test *this_local;
  
  ~AlignmentTests_TrimBack_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AlignmentTests, TrimBack) {
  auto a = readAlignment("0-3 7-7    ");
  ASSERT_EQ(2, a.size());
  EXPECT_EQ(0, a.front().src);
  EXPECT_EQ(3, a.front().tgt);
  EXPECT_EQ(7, a.back().src);
  EXPECT_EQ(7, a.back().tgt);
}